

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontStructMatrix.cpp
# Opt level: O0

void __thiscall
TPZParFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>::
TPZParFrontStructMatrix
          (TPZParFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_> *this,
          TPZCompMesh *mesh)

{
  TPZSavable *in_RDI;
  TPZCompMesh *in_stack_ffffffffffffffc0;
  TPZStack<TPZElementMatrix_*,_10> *this_00;
  void **in_stack_ffffffffffffffc8;
  pointer_____offset_0x68___ *this_01;
  
  this_01 = &TPZParFrontStructMatrix<TPZFrontSym<double>,double,TPZStructMatrixOR<double>>::VTT;
  TPZSavable::TPZSavable(in_RDI,&PTR_PTR_0258d9c0);
  TPZStrMatParInterface::TPZStrMatParInterface
            ((TPZStrMatParInterface *)(in_RDI + 0x4b),
             (void **)&((TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>
                         *)this_01)->field_0x88);
  TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>::TPZStructMatrix
            ((TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_> *)
             this_01,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  in_RDI->_vptr_TPZSavable =
       (_func_int **)
       (TPZParFrontStructMatrix<TPZFrontSym<double>,double,TPZStructMatrixOR<double>>::vtable + 0x68
       );
  in_RDI[0x4b]._vptr_TPZSavable =
       (_func_int **)
       (TPZParFrontStructMatrix<TPZFrontSym<double>,double,TPZStructMatrixOR<double>>::vtable +
       0x250);
  in_RDI->_vptr_TPZSavable =
       (_func_int **)
       (TPZParFrontStructMatrix<TPZFrontSym<double>,double,TPZStructMatrixOR<double>>::vtable + 0x68
       );
  in_RDI[0x14]._vptr_TPZSavable =
       (_func_int **)
       (TPZParFrontStructMatrix<TPZFrontSym<double>,double,TPZStructMatrixOR<double>>::vtable +
       0x150);
  TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
            ((TPZAutoPointer<TPZGuiInterface> *)in_stack_ffffffffffffffc0);
  this_00 = (TPZStack<TPZElementMatrix_*,_10> *)(in_RDI + 0x21);
  TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)this_00);
  TPZStack<TPZElementMatrix_*,_10>::TPZStack(this_00);
  TPZStack<TPZElementMatrix_*,_10>::TPZStack(this_00);
  *(undefined4 *)&in_RDI[0x1e]._vptr_TPZSavable = 500;
  TPZStrMatParInterface::SetNumThreads
            ((TPZStrMatParInterface *)
             (in_RDI->_vptr_TPZSavable[-0xc] + (long)&in_RDI->_vptr_TPZSavable),3);
  return;
}

Assistant:

TPZParFrontStructMatrix<TFront,TVar,TPar>::TPZParFrontStructMatrix(TPZCompMesh *mesh): TPZFrontStructMatrix<TFront,TVar,TPar>(mesh)
{
	fMaxStackSize = 500;
	TPZStructMatrix::SetNumThreads(3);
}